

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_bitwrite.c
# Opt level: O2

MPP_RET mpp_writer_reset(MppWriteCtx *ctx)

{
  ctx->stream = ctx->buffer;
  ctx->byte_cnt = 0;
  ctx->byte_buffer = 0;
  ctx->buffered_bits = 0;
  ctx->zero_bytes = 0;
  ctx->overflow = 0;
  ctx->emul_cnt = 0;
  return MPP_OK;
}

Assistant:

MPP_RET mpp_writer_reset(MppWriteCtx *ctx)
{
    ctx->stream = ctx->buffer;
    ctx->byte_cnt = 0;
    ctx->byte_buffer = 0;
    ctx->buffered_bits = 0;
    ctx->zero_bytes = 0;
    ctx->overflow = 0;
    ctx->emul_cnt = 0;

    return MPP_OK;
}